

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_std_formatting.cpp
# Opt level: O0

int main(void)

{
  __type _Var1;
  bool bVar2;
  int iVar3;
  _Setprecision _Var4;
  _Setw _Var5;
  ostream *poVar6;
  ulong uVar7;
  char *pcVar8;
  void *pvVar9;
  undefined8 uVar10;
  int passed;
  exception *e;
  ostringstream ss_1;
  ostringstream ss;
  bool fails;
  locale l2_4;
  locale l1_4;
  string name_4;
  string real_name_4;
  locale l2_3;
  locale l1_3;
  string name_3;
  string real_name_3;
  locale l2_2;
  locale l1_2;
  string name_2;
  string real_name_2;
  locale l2_1;
  locale l1_1;
  string name_1;
  string real_name_1;
  locale l2;
  locale l1;
  string name;
  string real_name;
  generator gen;
  localization_backend_manager mgr;
  locale *in_stack_00000ff8;
  locale *in_stack_00001000;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff810;
  string *in_stack_fffffffffffff818;
  runtime_error *in_stack_fffffffffffff820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff828;
  method_type how;
  string *in_stack_fffffffffffff830;
  allocator *paVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff838;
  bool local_7aa;
  allocator local_691;
  string local_690 [39];
  byte local_669;
  string local_668 [32];
  string local_648 [36];
  int local_624;
  locale local_620 [8];
  ostringstream local_618 [383];
  allocator local_499;
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  locale local_438 [8];
  ostringstream local_430 [383];
  byte local_2b1;
  locale local_2b0 [8];
  locale local_2a8 [15];
  allocator local_299;
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  locale local_238 [8];
  locale local_230 [15];
  allocator local_221;
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  locale local_1c0 [8];
  locale local_1b8 [15];
  allocator local_1a9;
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  locale local_148 [8];
  locale local_140 [15];
  allocator local_131;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  locale local_d0 [8];
  locale local_c8 [15];
  allocator local_b9;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  generator local_58 [8];
  localization_backend_manager local_50 [15];
  allocator local_41;
  string local_40 [48];
  string local_10 [12];
  undefined4 local_4;
  
  local_4 = 0;
  booster::locale::localization_backend_manager::global();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"std",&local_41);
  booster::locale::localization_backend_manager::select(local_10,(uint)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  booster::locale::localization_backend_manager::global(local_50);
  booster::locale::localization_backend_manager::~localization_backend_manager(local_50);
  booster::locale::generator::generator(local_58);
  poVar6 = std::operator<<((ostream *)&std::cout,"en_US.UTF locale");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string(local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"en_US.UTF-8",&local_b9);
  get_std_name(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    booster::locale::generator::operator()
              ((generator *)in_stack_fffffffffffff818,in_stack_fffffffffffff810);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    std::locale::locale(local_d0,pcVar8);
    poVar6 = std::operator<<((ostream *)&std::cout,"UTF-8");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    _Var1 = std::operator==(in_stack_fffffffffffff830,in_stack_fffffffffffff828);
    if (_Var1) {
      test_by_char<char,char>(in_stack_00001000,in_stack_00000ff8);
    }
    else {
      test_by_char<char,wchar_t>(in_stack_00001000,in_stack_00000ff8);
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"Wide UTF-");
    pvVar9 = (void *)std::ostream::operator<<(poVar6,0x20);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    test_by_char<wchar_t,wchar_t>(in_stack_00001000,in_stack_00000ff8);
    std::locale::~locale(local_d0);
    std::locale::~locale(local_c8);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"en_US.UTF-8 not supported");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_78);
  poVar6 = std::operator<<((ostream *)&std::cout,"en_US.Latin-1 locale");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string(local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"en_US.ISO8859-1",&local_131);
  get_std_name(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    booster::locale::generator::operator()
              ((generator *)in_stack_fffffffffffff818,in_stack_fffffffffffff810);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    std::locale::locale(local_148,pcVar8);
    test_by_char<char,char>(in_stack_00001000,in_stack_00000ff8);
    poVar6 = std::operator<<((ostream *)&std::cout,"Wide UTF-");
    pvVar9 = (void *)std::ostream::operator<<(poVar6,0x20);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    test_by_char<wchar_t,wchar_t>(in_stack_00001000,in_stack_00000ff8);
    std::locale::~locale(local_148);
    std::locale::~locale(local_140);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"en_US.ISO8859-8 not supported");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_f0);
  poVar6 = std::operator<<((ostream *)&std::cout,"he_IL.UTF locale");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string(local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"he_IL.UTF-8",&local_1a9);
  get_std_name(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    booster::locale::generator::operator()
              ((generator *)in_stack_fffffffffffff818,in_stack_fffffffffffff810);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    std::locale::locale(local_1c0,pcVar8);
    poVar6 = std::operator<<((ostream *)&std::cout,"UTF-8");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    _Var1 = std::operator==(in_stack_fffffffffffff830,in_stack_fffffffffffff828);
    how = (method_type)((ulong)in_stack_fffffffffffff828 >> 0x20);
    if (_Var1) {
      test_by_char<char,char>(in_stack_00001000,in_stack_00000ff8);
    }
    else {
      test_by_char<char,wchar_t>(in_stack_00001000,in_stack_00000ff8);
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"Wide UTF-");
    pvVar9 = (void *)std::ostream::operator<<(poVar6,0x20);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    test_by_char<wchar_t,wchar_t>(in_stack_00001000,in_stack_00000ff8);
    std::locale::~locale(local_1c0);
    std::locale::~locale(local_1b8);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"he_IL.UTF-8 not supported");
    how = (method_type)((ulong)in_stack_fffffffffffff828 >> 0x20);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::~string(local_168);
  poVar6 = std::operator<<((ostream *)&std::cout,"he_IL.ISO8859-8 locale");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string(local_1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"he_IL.ISO8859-8",&local_221);
  get_std_name(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    booster::locale::generator::operator()
              ((generator *)in_stack_fffffffffffff818,in_stack_fffffffffffff810);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    std::locale::locale(local_238,pcVar8);
    test_by_char<char,char>(in_stack_00001000,in_stack_00000ff8);
    poVar6 = std::operator<<((ostream *)&std::cout,"Wide UTF-");
    pvVar9 = (void *)std::ostream::operator<<(poVar6,0x20);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    test_by_char<wchar_t,wchar_t>(in_stack_00001000,in_stack_00000ff8);
    std::locale::~locale(local_238);
    std::locale::~locale(local_230);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"he_IL.ISO8859-8 not supported");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_1e0);
  poVar6 = std::operator<<((ostream *)&std::cout,"Testing UTF-8 punct workaround");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string(local_258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"ru_RU.UTF-8",&local_299);
  get_std_name(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    bVar2 = std::operator!=(in_stack_fffffffffffff810,in_stack_fffffffffffff808);
    if (bVar2) {
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "- Not having UTF-8 locale, no need for workaround");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    else {
      booster::locale::generator::operator()
                ((generator *)in_stack_fffffffffffff818,in_stack_fffffffffffff810);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      std::locale::locale(local_2b0,pcVar8);
      local_2b1 = 0;
      std::__cxx11::ostringstream::ostringstream(local_430);
      std::ios::imbue(local_438);
      std::locale::~locale(local_438);
      std::ostream::operator<<(local_430,12345.45);
      std::__cxx11::ostringstream::str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_498,"windows-1251",&local_499);
      booster::locale::conv::from_utf<char>(in_stack_fffffffffffff838,in_stack_fffffffffffff830,how)
      ;
      std::__cxx11::string::~string(local_458);
      std::__cxx11::string::~string(local_498);
      std::allocator<char>::~allocator((allocator<char> *)&local_499);
      std::__cxx11::string::~string(local_478);
      local_2b1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_430);
      if ((local_2b1 & 1) == 0) {
        poVar6 = std::operator<<((ostream *)&std::cout,"- No invalid UTF. No need to check");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_618);
        std::ios::imbue(local_620);
        std::locale::~locale(local_620);
        local_624 = (int)std::setprecision(10);
        std::operator<<((ostream *)local_618,(_Setprecision)local_624);
        pvVar9 = (void *)std::ostream::operator<<(local_618,booster::locale::as::number);
        std::ostream::operator<<(pvVar9,12345.45);
        test_counter = test_counter + 1;
        local_669 = 0;
        std::__cxx11::ostringstream::str();
        bVar2 = std::operator==(in_stack_fffffffffffff810,(char *)in_stack_fffffffffffff808);
        local_7aa = true;
        if (!bVar2) {
          std::__cxx11::ostringstream::str();
          local_669 = 1;
          local_7aa = std::operator==(in_stack_fffffffffffff810,(char *)in_stack_fffffffffffff808);
        }
        if ((local_669 & 1) != 0) {
          std::__cxx11::string::~string(local_668);
        }
        std::__cxx11::string::~string(local_648);
        if (local_7aa == false) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x161);
          poVar6 = std::operator<<(poVar6," ss.str() == \"12 345,45\" || ss.str()==\"12345,45\"");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          iVar3 = error_counter + 1;
          bVar2 = 0x14 < error_counter;
          error_counter = iVar3;
          if (bVar2) {
            uVar10 = __cxa_allocate_exception(0x30);
            paVar11 = &local_691;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_690,"Error limits reached, stopping unit test",paVar11);
            booster::runtime_error::runtime_error
                      (in_stack_fffffffffffff820,in_stack_fffffffffffff818);
            __cxa_throw(uVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        std::__cxx11::ostringstream::~ostringstream(local_618);
      }
      std::locale::~locale(local_2b0);
      std::locale::~locale(local_2a8);
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"- No russian locale");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_258);
  booster::locale::generator::~generator(local_58);
  booster::locale::localization_backend_manager::~localization_backend_manager
            ((localization_backend_manager *)local_10);
  iVar3 = test_counter - error_counter;
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Passed ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
  poVar6 = std::operator<<(poVar6," tests");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  if (0 < error_counter) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Failed ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,error_counter);
    poVar6 = std::operator<<(poVar6," tests");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  poVar6 = std::operator<<((ostream *)&std::cout," ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::fixed);
  _Var4 = std::setprecision(1);
  poVar6 = std::operator<<(poVar6,_Var4);
  _Var5 = std::setw(5);
  poVar6 = std::operator<<(poVar6,_Var5);
  poVar6 = (ostream *)
           std::ostream::operator<<(poVar6,((double)iVar3 * 100.0) / (double)test_counter);
  poVar6 = std::operator<<(poVar6,"% of tests completed sucsessefully");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  return (uint)(error_counter != 0);
}

Assistant:

int main()
{
    try {
        booster::locale::localization_backend_manager mgr = booster::locale::localization_backend_manager::global();
        mgr.select("std");
        booster::locale::localization_backend_manager::global(mgr);
        booster::locale::generator gen;

        {
            std::cout << "en_US.UTF locale" << std::endl;
            std::string real_name;
            std::string name = get_std_name("en_US.UTF-8",&real_name);
            if(name.empty()) {
                std::cout << "en_US.UTF-8 not supported" << std::endl;
            }
            else {
                std::locale l1=gen(name),l2(real_name.c_str());
                std::cout << "UTF-8" << std::endl;
                if(name==real_name) 
                    test_by_char<char,char>(l1,l2);
                else
                    test_by_char<char,wchar_t>(l1,l2);
                
                std::cout << "Wide UTF-" << sizeof(wchar_t) * 8 << std::endl;
                test_by_char<wchar_t,wchar_t>(l1,l2);

                #ifdef BOOSTER_HAS_CHAR16_T
                std::cout << "char16 UTF-16" << std::endl;
                test_by_char<char16_t,char16_t>(l1,l2);
                #endif
                #ifdef BOOSTER_HAS_CHAR32_T
                std::cout << "char32 UTF-32" << std::endl;
                test_by_char<char32_t,char32_t>(l1,l2);
                #endif
            }
        }
        {
            std::cout << "en_US.Latin-1 locale" << std::endl;
            std::string real_name;
            std::string name = get_std_name("en_US.ISO8859-1",&real_name);
            if(name.empty()) {
                std::cout << "en_US.ISO8859-8 not supported" << std::endl;
            }
            else {
                std::locale l1=gen(name),l2(real_name.c_str());
                test_by_char<char,char>(l1,l2);
                std::cout << "Wide UTF-" << sizeof(wchar_t) * 8 << std::endl;
                test_by_char<wchar_t,wchar_t>(l1,l2);

                #ifdef BOOSTER_HAS_CHAR16_T
                std::cout << "char16 UTF-16" << std::endl;
                test_by_char<char16_t,char16_t>(l1,l2);
                #endif
                #ifdef BOOSTER_HAS_CHAR32_T
                std::cout << "char32 UTF-32" << std::endl;
                test_by_char<char32_t,char32_t>(l1,l2);
                #endif
            }
        }
        {
            std::cout << "he_IL.UTF locale" << std::endl;
            std::string real_name;
            std::string name = get_std_name("he_IL.UTF-8",&real_name);
            if(name.empty()) {
                std::cout << "he_IL.UTF-8 not supported" << std::endl;
            }
            else {
                std::locale l1=gen(name),l2(real_name.c_str());
                std::cout << "UTF-8" << std::endl;
                if(name==real_name) 
                    test_by_char<char,char>(l1,l2);
                else
                    test_by_char<char,wchar_t>(l1,l2);
                
                std::cout << "Wide UTF-" << sizeof(wchar_t) * 8 << std::endl;
                test_by_char<wchar_t,wchar_t>(l1,l2);

                #ifdef BOOSTER_HAS_CHAR16_T
                std::cout << "char16 UTF-16" << std::endl;
                test_by_char<char16_t,char16_t>(l1,l2);
                #endif
                #ifdef BOOSTER_HAS_CHAR32_T
                std::cout << "char32 UTF-32" << std::endl;
                test_by_char<char32_t,char32_t>(l1,l2);
                #endif
            }
        }
        {
            std::cout << "he_IL.ISO8859-8 locale" << std::endl;
            std::string real_name;
            std::string name = get_std_name("he_IL.ISO8859-8",&real_name);
            if(name.empty()) {
                std::cout << "he_IL.ISO8859-8 not supported" << std::endl;
            }
            else {
                std::locale l1=gen(name),l2(real_name.c_str());
                test_by_char<char,char>(l1,l2);
                std::cout << "Wide UTF-" << sizeof(wchar_t) * 8 << std::endl;
                test_by_char<wchar_t,wchar_t>(l1,l2);

                #ifdef BOOSTER_HAS_CHAR16_T
                std::cout << "char16 UTF-16" << std::endl;
                test_by_char<char16_t,char16_t>(l1,l2);
                #endif
                #ifdef BOOSTER_HAS_CHAR32_T
                std::cout << "char32 UTF-32" << std::endl;
                test_by_char<char32_t,char32_t>(l1,l2);
                #endif
            }
        }
        {
            std::cout << "Testing UTF-8 punct workaround" << std::endl;
            std::string real_name;
            std::string name = get_std_name("ru_RU.UTF-8",&real_name);
            if(name.empty()) {
                std::cout << "- No russian locale" << std::endl;
            }
            else if(name != real_name) {
                std::cout << "- Not having UTF-8 locale, no need for workaround" << std::endl;
            }
            else {
                std::locale l1=gen(name),l2(real_name.c_str());
                bool fails = false;
                try {
                    std::ostringstream ss;
                    ss.imbue(l2);
                    ss << 12345.45;
                    booster::locale::conv::from_utf<char>(ss.str(),"windows-1251",booster::locale::conv::stop);
                    fails = false;
                }
                catch(...) {
                    fails = true;
                }
                
                if(!fails) {
                    std::cout << "- No invalid UTF. No need to check"<<std::endl;
                }
                else {
                    std::ostringstream ss;
                    ss.imbue(l1);
                    ss << std::setprecision(10) ;
                    ss << booster::locale::as::number << 12345.45;
                    TEST(ss.str() == "12 345,45" || ss.str()=="12345,45");
                }
            }
        }
    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return EXIT_FAILURE;
    }
    FINALIZE();

}